

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeModuleDynamicLink
          (uint32_t numModules,ze_module_handle_t *phModules,ze_module_build_log_handle_t *phLinkLog
          )

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ulong uVar7;
  ze_result_t unaff_EBP;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_94;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeModuleDynamicLink(numModules, phModulesLocal, phLinkLog)","");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0x510);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar7 = lVar4 - lVar2 >> 3;
    bVar9 = lVar4 != lVar2;
    local_94 = unaff_EBP;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        local_94 = (**(code **)(*plVar5 + 0x6a0))(plVar5,numModules,phModules,phLinkLog);
        if (local_94 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeModuleDynamicLink",local_94);
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
        local_94 = unaff_EBP;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return local_94;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZEHandleLifetimeValidation::zeModuleDynamicLinkPrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),numModules,phModules,
                           phLinkLog), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeModuleDynamicLink",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(numModules,phModules,phLinkLog);
    bVar9 = lVar4 != lVar2;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar5 + 0x6a8))(plVar5,numModules,phModules,phLinkLog,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeModuleDynamicLink",result);
          local_94 = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar2 = uVar8 + (-(ulong)(uVar7 == 0) - uVar7);
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar9) {
      return local_94;
    }
  }
  logAndPropagateResult("zeModuleDynamicLink",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleDynamicLink(
        uint32_t numModules,                            ///< [in] number of modules to be linked pointed to by phModules.
        ze_module_handle_t* phModules,                  ///< [in][range(0, numModules)] pointer to an array of modules to
                                                        ///< dynamically link together.
        ze_module_build_log_handle_t* phLinkLog         ///< [out][optional] pointer to handle of dynamic link log.
        )
    {
        context.logger->log_trace("zeModuleDynamicLink(numModules, phModulesLocal, phLinkLog)");

        auto pfnDynamicLink = context.zeDdiTable.Module.pfnDynamicLink;

        if( nullptr == pfnDynamicLink )
            return logAndPropagateResult("zeModuleDynamicLink", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeModuleDynamicLinkPrologue( numModules, phModules, phLinkLog );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeModuleDynamicLink", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeModuleDynamicLinkPrologue( numModules, phModules, phLinkLog );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeModuleDynamicLink", result);
        }

        auto driver_result = pfnDynamicLink( numModules, phModules, phLinkLog );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeModuleDynamicLinkEpilogue( numModules, phModules, phLinkLog ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeModuleDynamicLink", result);
        }

        return logAndPropagateResult("zeModuleDynamicLink", driver_result);
    }